

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void refresh(void)

{
  int iVar1;
  int local_10;
  int local_c;
  int j;
  int i;
  
  num_now[0] = 0;
  num_now[1] = 0;
  for (local_c = 0; local_c < 8; local_c = local_c + 1) {
    for (local_10 = 0; local_10 < 8; local_10 = local_10 + 1) {
      if ((chessboard[local_c][local_10] != '\x04') && (chessboard[local_c][local_10] != '\x05')) {
        chessboard[local_c][local_10] = '\0';
        iVar1 = canrev(local_c,local_10,chessboard,WHITE,0);
        if (0 < iVar1) {
          chessboard[local_c][local_10] = chessboard[local_c][local_10] + '\x01';
          num_now[0] = num_now[0] + 1;
        }
        iVar1 = canrev(local_c,local_10,chessboard,BLACK,0);
        if (0 < iVar1) {
          chessboard[local_c][local_10] = chessboard[local_c][local_10] + '\x02';
          num_now[1] = num_now[1] + 1;
        }
      }
    }
  }
  for (local_c = 0; local_c < 8; local_c = local_c + 1) {
    printf("   %c",(ulong)(local_c + 0x61));
  }
  for (local_c = 0; local_c < 8; local_c = local_c + 1) {
    printf("\n ");
    for (local_10 = 0; local_10 < 8; local_10 = local_10 + 1) {
      printf("+---");
    }
    printf("+\n%c",(ulong)(local_c + 0x31));
    for (local_10 = 0; local_10 < 8; local_10 = local_10 + 1) {
      printf("| %c ",(ulong)(uint)(int)symbol[chessboard[local_c][local_10]]);
    }
    printf("|");
  }
  printf("\n ");
  for (local_c = 0; local_c < 8; local_c = local_c + 1) {
    printf("+---");
  }
  printf("+\n");
  return;
}

Assistant:

void refresh() {
    int i, j;
    num_now[0] = 0;
    num_now[1] = 0;
    for (i = 0; i < SIZE; i++) {
        for (j = 0; j < SIZE; j++) {
            if (chessboard[i][j] != WHITE && chessboard[i][j] != BLACK) {
                chessboard[i][j] = 0;
                if (canrev(i, j, chessboard, WHITE, 0) > 0) {
                    chessboard[i][j] += WHITE_;
                    num_now[0]++;
                }
                if (canrev(i, j, chessboard, BLACK, 0) > 0) {
                    chessboard[i][j] += BLACK_;
                    num_now[1]++;
                }
            }
        }
    }
    for (i = 0; i < SIZE; i++) {
        printf("   %c", 'a' + i);
    }
    for (i = 0; i < SIZE; i++) {
        printf("\n ");
        for (j = 0; j < SIZE; j++) {
            printf("+---");
        }
        printf("+\n%c", '1' + i);
        for (j = 0; j < SIZE; j++) {
            printf("| %c ", symbol[chessboard[i][j]]);
        }
        printf("|");
    }
    printf("\n ");
    for (i = 0; i < SIZE; i++) {
        printf("+---");
    }
    printf("+\n");
}